

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O0

void __thiscall
phosg::BitmapImage::write_row(BitmapImage *this,size_t y,void *in_data,size_t size_bits)

{
  uint8_t *puVar1;
  size_t sVar2;
  out_of_range *this_00;
  unsigned_long *puVar3;
  size_t local_40 [3];
  size_t local_28;
  size_t size_bits_local;
  void *in_data_local;
  size_t y_local;
  BitmapImage *this_local;
  
  local_28 = size_bits;
  size_bits_local = (size_t)in_data;
  in_data_local = (void *)y;
  y_local = (size_t)this;
  if (this->height <= y) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    ::std::out_of_range::out_of_range(this_00,"out of bounds");
    __cxa_throw(this_00,&::std::out_of_range::typeinfo,::std::out_of_range::~out_of_range);
  }
  puVar1 = this->data;
  sVar2 = this->row_bytes;
  local_40[0] = byte_count_for_bit_count(size_bits);
  puVar3 = ::std::min<unsigned_long>(local_40,&this->row_bytes);
  memcpy(puVar1 + y * sVar2,in_data,*puVar3);
  return;
}

Assistant:

void BitmapImage::write_row(size_t y, const void* in_data, size_t size_bits) {
  if (y >= this->height) {
    throw out_of_range("out of bounds");
  }
  memcpy(&this->data[y * this->row_bytes], in_data, min<size_t>(byte_count_for_bit_count(size_bits), row_bytes));
}